

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regeximpl.h
# Opt level: O1

int __thiscall YAML::RegEx::Match<YAML::StreamCharSource>(RegEx *this,StreamCharSource *source)

{
  Stream *pSVar1;
  _Map_pointer ppcVar2;
  size_t sVar3;
  _Elt_pointer pcVar4;
  bool bVar5;
  int iVar6;
  _Elt_pointer pcVar7;
  char *pcVar8;
  ulong uVar9;
  
  pSVar1 = source->m_stream;
  ppcVar2 = (pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  if (((pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
       super__Deque_impl_data._M_start._M_last +
       (long)((pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur +
             ((((((ulong)((long)ppcVar2 -
                         (long)(pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>.
                               _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
               (ulong)(ppcVar2 == (_Map_pointer)0x0)) * 0x200 -
              (long)(pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first) -
             (long)(pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                   super__Deque_impl_data._M_start._M_cur)) <= (_Elt_pointer)source->m_offset) &&
     (bVar5 = YAML::Stream::_ReadAheadTo(pSVar1,source->m_offset), !bVar5)) {
    return -1;
  }
  iVar6 = -1;
  switch(this->m_op) {
  case REGEX_EMPTY:
    pSVar1 = source->m_stream;
    pcVar4 = (pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    pcVar7 = pcVar4 + (source->m_offset -
                      (long)(pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>.
                            _M_impl.super__Deque_impl_data._M_start._M_first);
    if (pcVar7 < (_Elt_pointer)0x200) {
      pcVar8 = pcVar4 + source->m_offset;
    }
    else {
      uVar9 = (ulong)pcVar7 >> 9 | 0xff80000000000000;
      if (0 < (long)pcVar7) {
        uVar9 = (ulong)pcVar7 >> 9;
      }
      pcVar8 = (pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
               super__Deque_impl_data._M_start._M_node[uVar9] + (long)(pcVar7 + uVar9 * -0x200);
    }
    return -(uint)(*pcVar8 != '\x04');
  case REGEX_MATCH:
    pSVar1 = source->m_stream;
    pcVar4 = (pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    pcVar7 = pcVar4 + (source->m_offset -
                      (long)(pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>.
                            _M_impl.super__Deque_impl_data._M_start._M_first);
    if (pcVar7 < (_Elt_pointer)0x200) {
      pcVar8 = pcVar4 + source->m_offset;
    }
    else {
      uVar9 = (ulong)pcVar7 >> 9 | 0xff80000000000000;
      if (0 < (long)pcVar7) {
        uVar9 = (ulong)pcVar7 >> 9;
      }
      pcVar8 = (pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
               super__Deque_impl_data._M_start._M_node[uVar9] + (long)(pcVar7 + uVar9 * -0x200);
    }
    bVar5 = *pcVar8 == this->m_a;
    break;
  case REGEX_RANGE:
    sVar3 = source->m_offset;
    pSVar1 = source->m_stream;
    pcVar4 = (pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    pcVar7 = pcVar4 + (sVar3 - (long)(pSVar1->m_readahead).
                                     super__Deque_base<char,_std::allocator<char>_>._M_impl.
                                     super__Deque_impl_data._M_start._M_first);
    if (pcVar7 < (_Elt_pointer)0x200) {
      pcVar8 = pcVar4 + sVar3;
    }
    else {
      uVar9 = (ulong)pcVar7 >> 9 | 0xff80000000000000;
      if (0 < (long)pcVar7) {
        uVar9 = (ulong)pcVar7 >> 9;
      }
      pcVar8 = (pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
               super__Deque_impl_data._M_start._M_node[uVar9] + (long)(pcVar7 + uVar9 * -0x200);
    }
    if (*pcVar8 < this->m_a) {
      return -1;
    }
    if (pcVar7 < (_Elt_pointer)0x200) {
      pcVar8 = pcVar4 + sVar3;
    }
    else {
      uVar9 = (ulong)pcVar7 >> 9 | 0xff80000000000000;
      if (0 < (long)pcVar7) {
        uVar9 = (ulong)pcVar7 >> 9;
      }
      pcVar8 = (pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
               super__Deque_impl_data._M_start._M_node[uVar9] + (long)(pcVar7 + uVar9 * -0x200);
    }
    bVar5 = *pcVar8 <= this->m_z;
    break;
  case REGEX_OR:
    iVar6 = MatchOpOr<YAML::StreamCharSource>(this,source);
    return iVar6;
  case REGEX_AND:
    iVar6 = MatchOpAnd<YAML::StreamCharSource>(this,source);
    return iVar6;
  case REGEX_NOT:
    iVar6 = MatchOpNot<YAML::StreamCharSource>(this,source);
    return iVar6;
  case REGEX_SEQ:
    iVar6 = MatchOpSeq<YAML::StreamCharSource>(this,source);
    return iVar6;
  default:
    goto switchD_00721ad3_default;
  }
  iVar6 = (uint)bVar5 * 2 + -1;
switchD_00721ad3_default:
  return iVar6;
}

Assistant:

inline int RegEx::Match(const Source& source) const {
  return IsValidSource(source) ? MatchUnchecked(source) : -1;
}